

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O2

key_encoder * __thiscall unodb::key_encoder::encode(key_encoder *this,uint16_t v)

{
  ensure_available(this,2);
  *(uint16_t *)(this->buf + this->off) = v << 8 | v >> 8;
  this->off = this->off + 2;
  return this;
}

Assistant:

key_encoder &encode(std::uint16_t v) {
    ensure_available(sizeof(v));
#ifdef UNODB_DETAIL_LITTLE_ENDIAN
    const auto u = unodb::detail::bswap(v);
#else
    const auto u = v;
#endif
    UNODB_DETAIL_ASSERT(sizeof(u) == sizeof(v));
    std::memcpy(buf + off, &u, sizeof(v));
    off += sizeof(v);
    return *this;
  }